

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

Array<Qentem::Value<char16_t>_> * __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::operator=
          (Array<Qentem::Value<char16_t>_> *this,Array<Qentem::Value<char16_t>_> *src)

{
  bool bVar1;
  SizeT SVar2;
  SizeT SVar3;
  Value<char16_t> *item;
  SizeT size;
  Value<char16_t> *storage;
  Array<Qentem::Value<char16_t>_> *src_local;
  Array<Qentem::Value<char16_t>_> *this_local;
  
  if (this != src) {
    item = Storage(this);
    SVar2 = Size(this);
    clearStorage(this);
    SVar3 = Size(src);
    setSize(this,SVar3);
    SVar3 = Size(src);
    setCapacity(this,SVar3);
    bVar1 = IsNotEmpty(this);
    if (bVar1) {
      copyArray(this,src);
    }
    Memory::Dispose<Qentem::Value<char16_t>>(item,item + SVar2);
    Memory::Deallocate(item);
  }
  return this;
}

Assistant:

Array &operator=(const Array &src) {
        if (this != &src) {
            Type_T     *storage = Storage();
            const SizeT size    = Size();

            clearStorage();
            setSize(src.Size());
            setCapacity(src.Size());

            if (IsNotEmpty()) {
                copyArray(src);
            }

            // Just in case the copied array is not a child array.
            Memory::Dispose(storage, (storage + size));
            Memory::Deallocate(storage);
        }

        return *this;
    }